

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O2

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,uint radix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  char *__first;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar3 = CONCAT44(0,radix);
  uVar6 = 0;
  do {
    __first = this->cursor_;
    uVar7 = (ulong)uVar6;
    if (this->end_ <= __first + uVar7) goto LAB_001213fc;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = number;
    bVar5 = SUB161(auVar2 % auVar1,0);
    bVar4 = bVar5 + 0x57;
    if (SUB168(auVar2 % auVar1,0) < 10) {
      bVar4 = bVar5 | 0x30;
    }
    uVar6 = uVar6 + 1;
    __first[uVar7] = bVar4;
    bVar8 = uVar3 <= number;
    number = number / uVar3;
  } while (bVar8);
  __first = this->cursor_;
  uVar7 = (ulong)uVar6;
LAB_001213fc:
  std::reverse<char*>(__first,__first + uVar7);
  this->cursor_ = this->cursor_ + uVar7;
  return;
}

Assistant:

void AppendUint64(uint64 number, unsigned radix) {
    unsigned i = 0;
    while (cursor_ + i < end_) {
      const uint64 tmp = number % radix;
      number /= radix;
      cursor_[i] = static_cast<char>(tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }